

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_ppmd8.c
# Opt level: O3

void Ppmd8_Construct(CPpmd8 *p)

{
  undefined1 auVar1 [16];
  int iVar2;
  ulong uVar3;
  long lVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  ulong uVar9;
  undefined1 auVar10 [16];
  long lVar11;
  
  p->Base = (Byte *)0x0;
  uVar3 = 0;
  uVar6 = 0;
  do {
    iVar7 = ((uint)(uVar3 >> 2) & 0x3fffffff) + 1;
    if (0xb < uVar3) {
      iVar7 = 4;
    }
    iVar8 = 0;
    uVar5 = uVar6;
    do {
      uVar9 = (ulong)uVar5;
      uVar5 = uVar5 + 1;
      p->Units2Indx[uVar9] = (Byte)uVar3;
      iVar8 = iVar8 + -1;
    } while (-iVar7 != iVar8);
    p->Indx2Units[uVar3] = (char)uVar6 - (char)iVar8;
    uVar3 = uVar3 + 1;
    uVar6 = uVar5;
  } while (uVar3 != 0x26);
  p->NS2BSIndx[0] = '\0';
  p->NS2BSIndx[1] = '\x02';
  p->NS2BSIndx[2] = '\x04';
  p->NS2BSIndx[3] = '\x04';
  p->NS2BSIndx[4] = '\x04';
  p->NS2BSIndx[5] = '\x04';
  p->NS2BSIndx[6] = '\x04';
  p->NS2BSIndx[7] = '\x04';
  p->NS2BSIndx[8] = '\x04';
  p->NS2BSIndx[9] = '\x04';
  p->NS2BSIndx[10] = '\x04';
  memset(p->NS2BSIndx + 0xb,6,0xf5);
  auVar1 = _DAT_008ff720;
  lVar4 = 0;
  auVar10 = _DAT_008ff710;
  do {
    if (SUB164(auVar10 ^ auVar1,4) == -0x80000000 && SUB164(auVar10 ^ auVar1,0) < -0x7ffffffb) {
      p->NS2Indx[lVar4] = (Byte)lVar4;
      p->NS2Indx[lVar4 + 1] = (Byte)lVar4 + '\x01';
    }
    lVar4 = lVar4 + 2;
    lVar11 = auVar10._8_8_;
    auVar10._0_8_ = auVar10._0_8_ + 2;
    auVar10._8_8_ = lVar11 + 2;
  } while (lVar4 != 6);
  iVar7 = 1;
  iVar8 = 5;
  lVar4 = 0;
  do {
    p->NS2Indx[lVar4 + 5] = (Byte)iVar8;
    iVar2 = iVar7 + -1;
    iVar7 = iVar2;
    if (iVar2 == 0) {
      iVar7 = iVar8 + -3;
    }
    iVar8 = (uint)(iVar2 == 0) + iVar8;
    lVar4 = lVar4 + 1;
  } while (lVar4 != 0xff);
  return;
}

Assistant:

void Ppmd8_Construct(CPpmd8 *p)
{
  unsigned i, k, m;

  p->Base = 0;

  for (i = 0, k = 0; i < PPMD_NUM_INDEXES; i++)
  {
    unsigned step = (i >= 12 ? 4 : (i >> 2) + 1);
    do { p->Units2Indx[k++] = (Byte)i; } while (--step);
    p->Indx2Units[i] = (Byte)k;
  }

  p->NS2BSIndx[0] = (0 << 1);
  p->NS2BSIndx[1] = (1 << 1);
  memset(p->NS2BSIndx + 2, (2 << 1), 9);
  memset(p->NS2BSIndx + 11, (3 << 1), 256 - 11);

  for (i = 0; i < 5; i++)
    p->NS2Indx[i] = (Byte)i;
  for (m = i, k = 1; i < 260; i++)
  {
    p->NS2Indx[i] = (Byte)m;
    if (--k == 0)
      k = (++m) - 4;
  }
}